

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O3

void rgbcx::prepare_bc1_single_color_table_half
               (bc1_match_entry *pTable,uint8_t *pExpand,int size,bc1_approx_mode mode)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  int i;
  long lVar4;
  bc1_match_entry *pbVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  
  lVar4 = 0;
  do {
    if (0 < size) {
      pbVar5 = pTable + lVar4;
      iVar6 = 0x100;
      uVar3 = 0;
      uVar7 = 0;
      do {
        bVar1 = pExpand[uVar7];
        uVar12 = (uint)bVar1;
        uVar8 = 0;
        uVar13 = uVar3;
        do {
          uVar9 = (uint)pExpand[uVar8];
          if (size == 0x20) {
            if (mode == cBC1AMD) {
LAB_00117c09:
              uVar9 = uVar9 + bVar1 + 1 >> 1;
            }
            else {
              if (mode != cBC1NVidia) goto LAB_00117c1d;
              uVar9 = (uint)(uVar13 >> 3);
            }
LAB_00117c0f:
            iVar10 = uVar9 - (int)lVar4;
            iVar2 = -iVar10;
            if (0 < iVar10) {
              iVar2 = iVar10;
            }
          }
          else {
            if (mode == cBC1AMD) goto LAB_00117c09;
            if (mode == cBC1NVidia) {
              iVar10 = uVar12 - uVar9;
              iVar2 = iVar10 + 3;
              if (-1 < iVar10) {
                iVar2 = iVar10;
              }
              iVar2 = (iVar2 >> 2) + uVar9 * 0x100;
              iVar11 = iVar10 * 0x80 + iVar2 + 0x80;
              iVar2 = iVar10 * 0x80 + iVar2 + 0x17f;
              if (-1 < iVar11) {
                iVar2 = iVar11;
              }
              uVar9 = iVar2 >> 8;
              goto LAB_00117c0f;
            }
LAB_00117c1d:
            iVar10 = (uVar12 + uVar9 >> 1) - (int)lVar4;
            iVar2 = -iVar10;
            if (0 < iVar10) {
              iVar2 = iVar10;
            }
            if ((mode == cBC1IdealRound4) || (mode == cBC1Ideal)) {
              iVar11 = uVar9 - uVar12;
              iVar10 = -iVar11;
              if (0 < iVar11) {
                iVar10 = iVar11;
              }
              iVar2 = iVar2 + (int)((ulong)(uint)(iVar10 * 3) * 0x28f5c29 >> 0x20);
            }
          }
          if ((iVar2 < iVar6) || ((uVar7 == uVar8 && (iVar2 == iVar6)))) {
            pbVar5->m_hi = (uint8_t)uVar8;
            pbVar5->m_lo = (uint8_t)uVar7;
            pbVar5->m_e = (uint8_t)iVar2;
            iVar6 = iVar2;
          }
          uVar8 = uVar8 + 1;
          uVar13 = (ulong)((int)uVar13 + 0x21);
        } while ((uint)size != uVar8);
        uVar7 = uVar7 + 1;
        uVar3 = (ulong)((int)uVar3 + 0x21);
      } while (uVar7 != (uint)size);
    }
    lVar4 = lVar4 + 1;
    if (lVar4 == 0x100) {
      return;
    }
  } while( true );
}

Assistant:

static void prepare_bc1_single_color_table_half(bc1_match_entry* pTable, const uint8_t* pExpand, int size, bc1_approx_mode mode)
	{
		for (int i = 0; i < 256; i++)
		{
			int lowest_e = 256;
			for (int lo = 0; lo < size; lo++)
			{
				const int lo_e = pExpand[lo];

				for (int hi = 0; hi < size; hi++)
				{
					const int hi_e = pExpand[hi];
										
					const int v = (size == 32) ? interp_half_5(hi, lo, hi_e, lo_e, mode) : interp_half_6(hi, lo, hi_e, lo_e, mode);
											
					int e = iabs(v - i);

					// We only need to factor in 3% error in BC1 ideal mode.
					if ((mode == bc1_approx_mode::cBC1Ideal) || (mode == bc1_approx_mode::cBC1IdealRound4))
						e += (iabs(hi_e - lo_e) * 3) / 100;

					// Favor equal endpoints, for lower error on actual GPU's which approximate the interpolation.
					if ((e < lowest_e) || ((e == lowest_e) && (lo == hi)))
					{
						pTable[i].m_hi = static_cast<uint8_t>(hi);
						pTable[i].m_lo = static_cast<uint8_t>(lo);
						
						assert(e <= UINT8_MAX);
						pTable[i].m_e = static_cast<uint8_t>(e);

						lowest_e = e;
					}

				} // hi
			} // lo
		}
	}